

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

void obj_ReadFile(char *fileName,uint fileID)

{
  Symbol *pSVar1;
  FileStackNodes *pFVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  FileStackNodeType FVar6;
  ExportLevel EVar7;
  SectionType SVar8;
  FILE *__stream;
  FileStackNode *pFVar9;
  char *pcVar10;
  int64_t iVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  uint32_t *puVar16;
  Symbol **ppSVar17;
  SymbolList *pSVar18;
  void *__ptr;
  Symbol *pSVar19;
  void *__ptr_00;
  Section *pSVar20;
  uint8_t *__ptr_01;
  size_t sVar21;
  Patch *pPVar22;
  long lVar23;
  Symbol **ppSVar24;
  Assertion *patch;
  int *piVar25;
  byte bVar26;
  SectionModifier SVar27;
  FileStackNode *pFVar28;
  long lVar29;
  Patch *patch_00;
  undefined8 uVar30;
  uint uVar31;
  char *pcVar32;
  char *fmt;
  uint uVar33;
  ulong uVar34;
  uint32_t i;
  int matchedElems;
  ulong local_50;
  char local_48 [24];
  
  uVar4 = (byte)*fileName - 0x2d;
  if (uVar4 == 0) {
    uVar4 = (uint)(byte)fileName[1];
  }
  if (uVar4 == 0) {
    __stream = fdopen(0,"rb");
  }
  else {
    __stream = fopen(fileName,"rb");
  }
  if (__stream == (FILE *)0x0) {
    pcVar10 = "Could not open file %s";
    goto LAB_00104760;
  }
  iVar5 = getc(__stream);
  ungetc(iVar5,__stream);
  pFVar2 = nodes;
  if (iVar5 == 0x52) {
    iVar5 = __isoc99_fscanf(__stream,"RGB9%n",&matchedElems);
    if ((iVar5 == 1) && (matchedElems != 4)) {
      errx("%s: Not a RGBDS object file",fileName);
    }
    if (beVerbose == true) {
      fprintf(_stderr,"Reading object file %s\n",fileName);
    }
    iVar11 = readlong((FILE *)__stream);
    if (iVar11 == 0x7fffffffffffffff) {
      iVar5 = feof(__stream);
      if (iVar5 == 0) {
        piVar25 = __errno_location();
        pcVar10 = strerror(*piVar25);
      }
      else {
        pcVar10 = "Unexpected end of file";
      }
      pcVar32 = "%s: Cannot read revision number: %s";
LAB_00104949:
      errx(pcVar32,fileName,pcVar10);
    }
    uVar4 = (uint)iVar11;
    if (uVar4 != 9) {
      pcVar10 = get_package_version_string();
      pcVar32 = "";
      if (9 < uVar4) {
        pcVar32 = " or updating rgblink";
      }
      errx("%s: Unsupported object file for rgblink %s; try rebuilding \"%s\"%s (expected revision %d, got %d)"
           ,fileName,pcVar10,fileName,pcVar32,9,uVar4);
    }
    uVar12 = readlong((FILE *)__stream);
    if (uVar12 == 0x7fffffffffffffff) {
      iVar5 = feof(__stream);
      if (iVar5 == 0) {
        piVar25 = __errno_location();
        pcVar10 = strerror(*piVar25);
      }
      else {
        pcVar10 = "Unexpected end of file";
      }
      pcVar32 = "%s: Cannot read number of symbols: %s";
      goto LAB_00104949;
    }
    uVar13 = readlong((FILE *)__stream);
    if (uVar13 == 0x7fffffffffffffff) {
      iVar5 = feof(__stream);
      if (iVar5 == 0) {
        piVar25 = __errno_location();
        pcVar10 = strerror(*piVar25);
      }
      else {
        pcVar10 = "Unexpected end of file";
      }
      pcVar32 = "%s: Cannot read number of sections: %s";
      goto LAB_00104949;
    }
    nbSectionsToAssign = nbSectionsToAssign + (uVar13 & 0xffffffff);
    uVar14 = readlong((FILE *)__stream);
    pFVar2 = nodes;
    if (uVar14 == 0x7fffffffffffffff) {
      iVar5 = feof(__stream);
      if (iVar5 == 0) {
        piVar25 = __errno_location();
        pcVar10 = strerror(*piVar25);
      }
      else {
        pcVar10 = "Unexpected end of file";
      }
      pcVar32 = "%s: Cannot read number of nodes: %s";
      goto LAB_00104949;
    }
    nodes[fileID].nbNodes = (uint32_t)uVar14;
    pFVar9 = (FileStackNode *)calloc(uVar14 & 0xffffffff,0x20);
    pFVar2[fileID].nodes = pFVar9;
    if (pFVar9 != (FileStackNode *)0x0) {
      if (beVerbose == true) {
        fprintf(_stderr,"Reading %u nodes...\n",uVar14 & 0xffffffff);
        uVar14 = (ulong)nodes[fileID].nbNodes;
      }
      while ((int)uVar14 != 0) {
        uVar4 = (int)uVar14 - 1;
        uVar14 = (ulong)uVar4;
        pFVar9 = nodes[fileID].nodes;
        uVar15 = readlong((FILE *)__stream);
        if (uVar15 == 0x7fffffffffffffff) {
          iVar5 = feof(__stream);
          if (iVar5 == 0) {
            piVar25 = __errno_location();
            pcVar10 = strerror(*piVar25);
          }
          else {
            pcVar10 = "Unexpected end of file";
          }
          pcVar32 = "%s: Cannot read node #%u\'s parent ID: %s";
LAB_00104a4e:
          errx(pcVar32,fileName,uVar14,pcVar10);
        }
        pFVar28 = pFVar9 + (uVar15 & 0xffffffff);
        if ((uVar15 & 0xffffffff) == 0xffffffff) {
          pFVar28 = (FileStackNode *)0x0;
        }
        pFVar9[uVar14].parent = pFVar28;
        iVar11 = readlong((FILE *)__stream);
        if (iVar11 == 0x7fffffffffffffff) {
          iVar5 = feof(__stream);
          if (iVar5 == 0) {
            piVar25 = __errno_location();
            pcVar10 = strerror(*piVar25);
          }
          else {
            pcVar10 = "Unexpected end of file";
          }
          pcVar32 = "%s: Cannot read node #%u\'s line number: %s";
          goto LAB_00104a4e;
        }
        pFVar9 = pFVar9 + uVar14;
        pFVar9->lineNo = (uint32_t)iVar11;
        FVar6 = getc(__stream);
        if (FVar6 == ~NODE_REPT) {
          iVar5 = feof(__stream);
          if (iVar5 == 0) {
            piVar25 = __errno_location();
            pcVar10 = strerror(*piVar25);
          }
          else {
            pcVar10 = "Unexpected end of file";
          }
          pcVar32 = "%s: Cannot read node #%u\'s type: %s";
          goto LAB_00104a4e;
        }
        pFVar9->type = FVar6;
        if (FVar6 - NODE_FILE < 2) {
          pcVar10 = readstr((FILE *)__stream);
          if (pcVar10 == (char *)0x0) {
            iVar5 = feof(__stream);
            if (iVar5 == 0) {
              piVar25 = __errno_location();
              pcVar10 = strerror(*piVar25);
            }
            else {
              pcVar10 = "Unexpected end of file";
            }
            pcVar32 = "%s: Cannot read node #%u\'s file name: %s";
            goto LAB_00104a4e;
          }
          (pFVar9->field_3).name = pcVar10;
        }
        else if (FVar6 == NODE_REPT) {
          uVar15 = readlong((FILE *)__stream);
          if (uVar15 == 0x7fffffffffffffff) {
            iVar5 = feof(__stream);
            if (iVar5 == 0) {
              piVar25 = __errno_location();
              pcVar10 = strerror(*piVar25);
            }
            else {
              pcVar10 = "Unexpected end of file";
            }
            pcVar32 = "%s: Cannot read node #%u\'s rept depth: %s";
            goto LAB_00104a4e;
          }
          (pFVar9->field_3).field_1.reptDepth = (uint32_t)uVar15;
          puVar16 = (uint32_t *)malloc((uVar15 & 0xffffffff) << 2);
          (pFVar9->field_3).field_1.iters = puVar16;
          if (puVar16 == (uint32_t *)0x0) {
            piVar25 = __errno_location();
            pcVar10 = strerror(*piVar25);
            fatal((FileStackNode *)0x0,0,"%s: Failed to alloc node #%u\'s iters: %s",fileName,
                  (ulong)uVar4,pcVar10);
          }
          for (uVar34 = 0; uVar34 < (uVar15 & 0xffffffff); uVar34 = uVar34 + 1) {
            iVar11 = readlong((FILE *)__stream);
            if (iVar11 == 0x7fffffffffffffff) {
              iVar5 = feof(__stream);
              if (iVar5 == 0) {
                piVar25 = __errno_location();
                pcVar10 = strerror(*piVar25);
              }
              else {
                pcVar10 = "Unexpected end of file";
              }
              errx("%s: Cannot read node #%u\'s iter #%u: %s",fileName,uVar14,uVar34 & 0xffffffff,
                   pcVar10);
            }
            (pFVar9->field_3).field_1.iters[uVar34] = (uint32_t)iVar11;
            uVar15 = (ulong)(pFVar9->field_3).field_1.reptDepth;
          }
          if (pFVar9->parent == (FileStackNode *)0x0) {
            fatal((FileStackNode *)0x0,0,
                  "%s is not a valid object file: root node (#%u) may not be REPT",fileName,uVar14);
          }
        }
      }
      ppSVar17 = (Symbol **)malloc((uVar12 & 0xffffffff) * 8 + 1);
      if (ppSVar17 == (Symbol **)0x0) {
        pcVar10 = "Failed to get memory for %s\'s symbols";
      }
      else {
        pSVar18 = (SymbolList *)malloc(0x18);
        if (pSVar18 != (SymbolList *)0x0) {
          pSVar18->symbolList = ppSVar17;
          pSVar18->nbSymbols = uVar12 & 0xffffffff;
          pSVar18->next = symbolLists;
          uVar14 = (ulong)((int)uVar13 + (uint)((int)uVar13 == 0));
          symbolLists = pSVar18;
          __ptr = calloc(uVar14,4);
          if (beVerbose == true) {
            fprintf(_stderr,"Reading %u symbols...\n",uVar12 & 0xffffffff);
          }
          for (uVar15 = 0; (uVar12 & 0xffffffff) != uVar15; uVar15 = uVar15 + 1) {
            pSVar19 = (Symbol *)malloc(0x38);
            if (pSVar19 == (Symbol *)0x0) {
              pcVar10 = "%s: Couldn\'t create new symbol";
              goto LAB_00104760;
            }
            pFVar9 = nodes[fileID].nodes;
            pcVar10 = readstr((FILE *)__stream);
            if (pcVar10 == (char *)0x0) {
              iVar5 = feof(__stream);
              if (iVar5 == 0) {
                piVar25 = __errno_location();
                pcVar10 = strerror(*piVar25);
              }
              else {
                pcVar10 = "Unexpected end of file";
              }
              pcVar32 = "%s: Cannot read symbol name: %s";
              goto LAB_00104949;
            }
            pSVar19->name = pcVar10;
            EVar7 = getc(__stream);
            if (EVar7 == ~SYMTYPE_LOCAL) {
              pcVar10 = pSVar19->name;
              goto LAB_001045e9;
            }
            pSVar19->type = EVar7;
            if (EVar7 == SYMTYPE_IMPORT) {
              pSVar19->sectionID = -1;
              ppSVar17[uVar15] = pSVar19;
            }
            else {
              pSVar19->objFileName = fileName;
              uVar34 = readlong((FILE *)__stream);
              if (uVar34 == 0x7fffffffffffffff) {
                pcVar10 = pSVar19->name;
                iVar5 = feof(__stream);
                if (iVar5 == 0) {
                  piVar25 = __errno_location();
                  pcVar32 = strerror(*piVar25);
                }
                else {
                  pcVar32 = "Unexpected end of file";
                }
                fmt = "%s: Cannot read \"%s\"\'s node ID: %s";
                goto LAB_00104a31;
              }
              pSVar19->src = pFVar9 + (uVar34 & 0xffffffff);
              iVar11 = readlong((FILE *)__stream);
              if (iVar11 == 0x7fffffffffffffff) {
                pcVar10 = pSVar19->name;
                iVar5 = feof(__stream);
                if (iVar5 == 0) {
                  piVar25 = __errno_location();
                  pcVar32 = strerror(*piVar25);
                }
                else {
                  pcVar32 = "Unexpected end of file";
                }
                fmt = "%s: Cannot read \"%s\"\'s line number: %s";
                goto LAB_00104a31;
              }
              pSVar19->lineNo = (int32_t)iVar11;
              iVar11 = readlong((FILE *)__stream);
              if (iVar11 == 0x7fffffffffffffff) {
                pcVar10 = pSVar19->name;
                iVar5 = feof(__stream);
                if (iVar5 == 0) {
                  piVar25 = __errno_location();
                  pcVar32 = strerror(*piVar25);
                }
                else {
                  pcVar32 = "Unexpected end of file";
                }
                fmt = "%s: Cannot read \"%s\"\'s section ID: %s";
                goto LAB_00104a31;
              }
              pSVar19->sectionID = (int32_t)iVar11;
              iVar11 = readlong((FILE *)__stream);
              if (iVar11 == 0x7fffffffffffffff) {
                pcVar10 = pSVar19->name;
                iVar5 = feof(__stream);
                if (iVar5 == 0) {
                  piVar25 = __errno_location();
                  pcVar32 = strerror(*piVar25);
                }
                else {
                  pcVar32 = "Unexpected end of file";
                }
                fmt = "%s: Cannot read \"%s\"\'s value: %s";
                goto LAB_00104a31;
              }
              (pSVar19->field_6).offset = (int32_t)iVar11;
              EVar7 = pSVar19->type;
              ppSVar17[uVar15] = pSVar19;
              if (EVar7 == SYMTYPE_EXPORT) {
                sym_AddSymbol(pSVar19);
              }
            }
            if ((long)pSVar19->sectionID != -1) {
              piVar25 = (int *)((long)__ptr + (long)pSVar19->sectionID * 4);
              *piVar25 = *piVar25 + 1;
            }
          }
          __ptr_00 = malloc(uVar14 << 3);
          if (beVerbose != false) {
            fprintf(_stderr,"Reading %u sections...\n",uVar13 & 0xffffffff);
          }
          local_50 = uVar13 & 0xffffffff;
          for (uVar13 = 0; uVar14 = local_50, uVar13 != local_50; uVar13 = uVar13 + 1) {
            pSVar20 = (Section *)malloc(0x60);
            *(Section **)((long)__ptr_00 + uVar13 * 8) = pSVar20;
            if (pSVar20 == (Section *)0x0) {
              pcVar10 = "%s: Couldn\'t create new section";
              goto LAB_00104760;
            }
            pSVar20->nextu = (Section *)0x0;
            pFVar9 = nodes[fileID].nodes;
            pcVar10 = readstr((FILE *)__stream);
            if (pcVar10 == (char *)0x0) {
              iVar5 = feof(__stream);
              if (iVar5 == 0) {
                piVar25 = __errno_location();
                pcVar10 = strerror(*piVar25);
              }
              else {
                pcVar10 = "Unexpected end of file";
              }
              pcVar32 = "%s: Cannot read section name: %s";
              goto LAB_00104949;
            }
            pSVar20->name = pcVar10;
            uVar14 = readlong((FILE *)__stream);
            if (uVar14 == 0x7fffffffffffffff) {
              pcVar10 = pSVar20->name;
              iVar5 = feof(__stream);
              if (iVar5 == 0) {
                piVar25 = __errno_location();
                pcVar32 = strerror(*piVar25);
              }
              else {
                pcVar32 = "Unexpected end of file";
              }
              fmt = "%s: Cannot read \"%s\"\'s\' size: %s";
              goto LAB_00104a31;
            }
            if (0xffff < (uint)uVar14) {
              errx("\"%s\"\'s section size (%d) is invalid",pSVar20->name,uVar14 & 0xffffffff);
            }
            pSVar20->size = (uint16_t)uVar14;
            pSVar20->offset = 0;
            SVar8 = getc(__stream);
            if (SVar8 == ~SECTTYPE_WRAM0) {
              pcVar10 = pSVar20->name;
LAB_001045e9:
              iVar5 = feof(__stream);
              if (iVar5 == 0) {
                piVar25 = __errno_location();
                pcVar32 = strerror(*piVar25);
              }
              else {
                pcVar32 = "Unexpected end of file";
              }
              fmt = "%s: Cannot read \"%s\"\'s type: %s";
LAB_00104a31:
              errx(fmt,fileName,pcVar10,pcVar32);
            }
            pSVar20->type = SVar8 & 0x3f;
            if ((SVar8 & 0xff) < 0x80) {
              if ((SVar8 & 0xff) < 0x40) {
                pSVar20->modifier = SECTION_NORMAL;
              }
              else {
                pSVar20->modifier = SECTION_FRAGMENT;
              }
            }
            else {
              pSVar20->modifier = SECTION_UNION;
            }
            iVar11 = readlong((FILE *)__stream);
            if (iVar11 == 0x7fffffffffffffff) {
              pcVar10 = pSVar20->name;
              iVar5 = feof(__stream);
              if (iVar5 == 0) {
                piVar25 = __errno_location();
                pcVar32 = strerror(*piVar25);
              }
              else {
                pcVar32 = "Unexpected end of file";
              }
              fmt = "%s: Cannot read \"%s\"\'s org: %s";
              goto LAB_00104a31;
            }
            pSVar20->isAddressFixed = -1 < (int)iVar11;
            if (0xffff < (int)iVar11) {
              error((FileStackNode *)0x0,0,"\"%s\"\'s org is too large (%d)",pSVar20->name);
              iVar11 = 0xffff;
            }
            pSVar20->org = (uint16_t)iVar11;
            iVar11 = readlong((FILE *)__stream);
            if (iVar11 == 0x7fffffffffffffff) {
              pcVar10 = pSVar20->name;
              iVar5 = feof(__stream);
              if (iVar5 == 0) {
                piVar25 = __errno_location();
                pcVar32 = strerror(*piVar25);
              }
              else {
                pcVar32 = "Unexpected end of file";
              }
              fmt = "%s: Cannot read \"%s\"\'s bank: %s";
              goto LAB_00104a31;
            }
            pSVar20->isBankFixed = -1 < (int)(uint32_t)iVar11;
            pSVar20->bank = (uint32_t)iVar11;
            uVar4 = getc(__stream);
            if (uVar4 == 0xffffffff) {
              pcVar10 = pSVar20->name;
              iVar5 = feof(__stream);
              if (iVar5 == 0) {
                piVar25 = __errno_location();
                pcVar32 = strerror(*piVar25);
              }
              else {
                pcVar32 = "Unexpected end of file";
              }
              fmt = "%s: Cannot read \"%s\"\'s alignment: %s";
              goto LAB_00104a31;
            }
            bVar26 = 0x10;
            if ((uVar4 & 0xff) < 0x10) {
              bVar26 = (byte)uVar4;
            }
            pSVar20->isAlignFixed = (uVar4 & 0xff) != 0;
            pSVar20->alignMask = ~(ushort)(-1 << (bVar26 & 0x1f));
            iVar11 = readlong((FILE *)__stream);
            if (iVar11 == 0x7fffffffffffffff) {
              pcVar10 = pSVar20->name;
              iVar5 = feof(__stream);
              if (iVar5 == 0) {
                piVar25 = __errno_location();
                pcVar32 = strerror(*piVar25);
              }
              else {
                pcVar32 = "Unexpected end of file";
              }
              fmt = "%s: Cannot read \"%s\"\'s alignment offset: %s";
              goto LAB_00104a31;
            }
            if (0xffff < (int)iVar11) {
              error((FileStackNode *)0x0,0,"\"%s\"\'s alignment offset is too large (%d)",
                    pSVar20->name);
              iVar11 = 0xffff;
            }
            pSVar20->alignOfs = (uint16_t)iVar11;
            bVar3 = sect_HasData(pSVar20->type);
            if (bVar3) {
              uVar14 = (ulong)pSVar20->size;
              __ptr_01 = (uint8_t *)malloc(uVar14 + 1);
              if (__ptr_01 == (uint8_t *)0x0) {
                pcVar10 = pSVar20->name;
                pcVar32 = "%s: Unable to read \"%s\"\'s data";
LAB_00104917:
                err(pcVar32,fileName,pcVar10);
              }
              if ((uVar14 != 0) &&
                 (sVar21 = fread(__ptr_01,1,uVar14,__stream), sVar21 != pSVar20->size)) {
                pcVar10 = pSVar20->name;
                iVar5 = feof(__stream);
                if (iVar5 == 0) {
                  piVar25 = __errno_location();
                  pcVar32 = strerror(*piVar25);
                }
                else {
                  pcVar32 = "Unexpected end of file";
                }
                fmt = "%s: Cannot read \"%s\"\'s data: %s";
                goto LAB_00104a31;
              }
              pSVar20->data = __ptr_01;
              uVar14 = readlong((FILE *)__stream);
              if (uVar14 == 0x7fffffffffffffff) {
                pcVar10 = pSVar20->name;
                iVar5 = feof(__stream);
                if (iVar5 == 0) {
                  piVar25 = __errno_location();
                  pcVar32 = strerror(*piVar25);
                }
                else {
                  pcVar32 = "Unexpected end of file";
                }
                fmt = "%s: Cannot read \"%s\"\'s number of patches: %s";
                goto LAB_00104a31;
              }
              pSVar20->nbPatches = (uint32_t)uVar14;
              pPVar22 = (Patch *)malloc((uVar14 & 0xffffffff) * 0x30 + 1);
              if (pPVar22 == (Patch *)0x0) {
                pcVar10 = pSVar20->name;
                pcVar32 = "%s: Unable to read \"%s\"\'s patches";
                goto LAB_00104917;
              }
              patch_00 = pPVar22;
              for (uVar15 = 0; uVar15 < (uVar14 & 0xffffffff); uVar15 = uVar15 + 1) {
                readPatch((FILE *)__stream,patch_00,fileName,pSVar20->name,(uint32_t)uVar15,pFVar9);
                uVar14 = (ulong)pSVar20->nbPatches;
                patch_00 = patch_00 + 1;
              }
              lVar23 = 0x38;
            }
            else {
              lVar23 = 0x28;
              pPVar22 = (Patch *)0x0;
            }
            *(Patch **)((long)&pSVar20->name + lVar23) = pPVar22;
            pSVar20->fileSymbols = ppSVar17;
            uVar14 = (ulong)*(uint *)((long)__ptr + uVar13 * 4);
            if (uVar14 == 0) {
              pSVar20->symbols = (Symbol **)0x0;
            }
            else {
              ppSVar24 = (Symbol **)malloc(uVar14 << 3);
              pSVar20->symbols = ppSVar24;
              if (ppSVar24 == (Symbol **)0x0) {
                pcVar10 = "%s: Couldn\'t link to symbols";
                goto LAB_00104760;
              }
            }
            pSVar20->nbSymbols = 0;
            sect_AddSection(pSVar20);
          }
          free(__ptr);
          for (uVar13 = 0; uVar13 != uVar14; uVar13 = uVar13 + 1) {
            lVar23 = *(long *)((long)__ptr_00 + uVar13 * 8);
            bVar3 = sect_HasData(*(SectionType *)(lVar23 + 0xc));
            if (bVar3) {
              uVar4 = *(uint *)(lVar23 + 0x30);
              for (lVar29 = 0; (ulong)uVar4 * 0x30 - lVar29 != 0; lVar29 = lVar29 + 0x30) {
                uVar15 = (ulong)*(uint *)(*(long *)(lVar23 + 0x38) + 0x10 + lVar29);
                if (uVar15 == 0xffffffff) {
                  uVar30 = 0;
                }
                else {
                  uVar30 = *(undefined8 *)((long)__ptr_00 + uVar15 * 8);
                }
                *(undefined8 *)(*(long *)(lVar23 + 0x38) + 0x28 + lVar29) = uVar30;
              }
            }
          }
          for (uVar13 = 0; uVar13 != (uVar12 & 0xffffffff); uVar13 = uVar13 + 1) {
            pSVar19 = ppSVar17[uVar13];
            if ((long)pSVar19->sectionID == -1) {
              pSVar20 = (Section *)0x0;
            }
            else {
              pSVar20 = *(Section **)((long)__ptr_00 + (long)pSVar19->sectionID * 8);
              uVar4 = pSVar20->nbSymbols;
              uVar14 = 0;
              uVar33 = uVar4;
              while (uVar31 = uVar33, (uint)uVar14 != uVar31) {
                uVar33 = uVar31 + (uint)uVar14 >> 1;
                if ((pSVar20->symbols[uVar33]->field_6).offset <= (pSVar19->field_6).offset) {
                  uVar14 = (ulong)(uVar33 + 1);
                  uVar33 = uVar31;
                }
              }
              for (; (uint)uVar14 <= uVar4; uVar14 = (ulong)((uint)uVar14 + 1)) {
                pSVar1 = pSVar20->symbols[uVar14];
                pSVar20->symbols[uVar14] = pSVar19;
                pSVar19 = pSVar1;
              }
              pSVar20->nbSymbols = uVar4 + 1;
              SVar27 = pSVar20->modifier;
              if (SVar27 != SECTION_NORMAL) {
                if (SVar27 == SECTION_FRAGMENT) {
                  (ppSVar17[uVar13]->field_6).offset =
                       (ppSVar17[uVar13]->field_6).offset + (uint)pSVar20->offset;
                  SVar27 = pSVar20->modifier;
                }
                if (SVar27 != SECTION_NORMAL) {
                  pSVar20 = sect_GetSection(pSVar20->name);
                }
              }
              pSVar19 = ppSVar17[uVar13];
            }
            pSVar19->section = pSVar20;
          }
          uVar12 = readlong((FILE *)__stream);
          if (uVar12 == 0x7fffffffffffffff) {
            iVar5 = feof(__stream);
            if (iVar5 == 0) {
              piVar25 = __errno_location();
              pcVar10 = strerror(*piVar25);
            }
            else {
              pcVar10 = "Unexpected end of file";
            }
            pcVar32 = "%s: Cannot read number of assertions: %s";
          }
          else {
            if (beVerbose == true) {
              fprintf(_stderr,"Reading %u assertions...\n",uVar12 & 0xffffffff);
            }
            uVar4 = 0;
            while( true ) {
              if ((uint)uVar12 == uVar4) {
                free(__ptr_00);
                fclose(__stream);
                return;
              }
              patch = (Assertion *)malloc(0x48);
              if (patch == (Assertion *)0x0) {
                pcVar10 = "%s: Couldn\'t create new assertion";
                goto LAB_00104760;
              }
              pFVar9 = nodes[fileID].nodes;
              snprintf(local_48,0x16,"Assertion #%u",(ulong)uVar4);
              readPatch((FILE *)__stream,(Patch *)patch,fileName,local_48,0,pFVar9);
              pcVar10 = readstr((FILE *)__stream);
              if (pcVar10 == (char *)0x0) break;
              patch->message = pcVar10;
              uVar13 = (ulong)(patch->patch).pcSectionID;
              if (uVar13 == 0xffffffff) {
                pSVar20 = (Section *)0x0;
              }
              else {
                pSVar20 = *(Section **)((long)__ptr_00 + uVar13 * 8);
              }
              (patch->patch).pcSection = pSVar20;
              patch->fileSymbols = ppSVar17;
              patch->next = assertions;
              uVar4 = uVar4 + 1;
              assertions = patch;
            }
            iVar5 = feof(__stream);
            if (iVar5 == 0) {
              piVar25 = __errno_location();
              pcVar10 = strerror(*piVar25);
            }
            else {
              pcVar10 = "Unexpected end of file";
            }
            pcVar32 = "%s: Cannot read assertion\'s message: %s";
          }
          goto LAB_00104949;
        }
        pcVar10 = "Failed to register %s\'s symbol list";
      }
      goto LAB_00104760;
    }
  }
  else {
    if (iVar5 == -1) {
      fatal((FileStackNode *)0x0,0,"File \"%s\" is empty!",fileName);
    }
    nodes[fileID].nbNodes = 1;
    pFVar9 = (FileStackNode *)malloc(0x20);
    pFVar2[fileID].nodes = pFVar9;
    if (pFVar9 != (FileStackNode *)0x0) {
      pFVar9->parent = (FileStackNode *)0x0;
      pFVar9->type = NODE_FILE;
      pcVar10 = strdup(fileName);
      (pFVar9->field_3).name = pcVar10;
      if (pcVar10 == (char *)0x0) {
        piVar25 = __errno_location();
        pcVar10 = strerror(*piVar25);
        fatal((FileStackNode *)0x0,0,"Failed to duplicate \"%s\"\'s name: %s",fileName,pcVar10);
      }
      sdobj_ReadFile(pFVar9,(FILE *)__stream);
      return;
    }
  }
  pcVar10 = "Failed to get memory for %s\'s nodes";
LAB_00104760:
  err(pcVar10,fileName);
}

Assistant:

void obj_ReadFile(char const *fileName, unsigned int fileID)
{
	FILE *file;

	if (strcmp("-", fileName) != 0)
		file = fopen(fileName, "rb");
	else
		file = fdopen(STDIN_FILENO, "rb"); // `stdin` is in text mode by default

	if (!file)
		err("Could not open file %s", fileName);

	// First, check if the object is a RGBDS object or a SDCC one. If the first byte is 'R',
	// we'll assume it's a RGBDS object file, and otherwise, that it's a SDCC object file.
	int c = getc(file);

	ungetc(c, file); // Guaranteed to work
	switch (c) {
	case EOF:
		fatal(NULL, 0, "File \"%s\" is empty!", fileName);

	case 'R':
		break;

	default: // This is (probably) a SDCC object file, defer the rest of detection to it
		// Since SDCC does not provide line info, everything will be reported as coming from the
		// object file. It's better than nothing.
		nodes[fileID].nbNodes = 1;
		nodes[fileID].nodes =
			(struct FileStackNode *)malloc(sizeof(nodes[fileID].nodes[0]) * nodes[fileID].nbNodes);
		if (!nodes[fileID].nodes)
			err("Failed to get memory for %s's nodes", fileName);
		struct FileStackNode *where = &nodes[fileID].nodes[0];

		if (!where)
			fatal(NULL, 0, "Failed to alloc fstack node for \"%s\": %s", fileName, strerror(errno));
		where->parent = NULL;
		where->type = NODE_FILE;
		where->name = strdup(fileName);
		if (!where->name)
			fatal(NULL, 0, "Failed to duplicate \"%s\"'s name: %s", fileName, strerror(errno));

		sdobj_ReadFile(where, file);
		return;
	}

	// Begin by reading the magic bytes
	int matchedElems;

	if (fscanf(file, RGBDS_OBJECT_VERSION_STRING "%n", &matchedElems) == 1
	 && matchedElems != strlen(RGBDS_OBJECT_VERSION_STRING))
		errx("%s: Not a RGBDS object file", fileName);

	verbosePrint("Reading object file %s\n",
		     fileName);

	uint32_t revNum;

	tryReadlong(revNum, file, "%s: Cannot read revision number: %s",
		    fileName);
	if (revNum != RGBDS_OBJECT_REV)
		errx("%s: Unsupported object file for rgblink %s; try rebuilding \"%s\"%s"
			" (expected revision %d, got %d)", fileName, get_package_version_string(),
			fileName, revNum > RGBDS_OBJECT_REV ? " or updating rgblink" : "",
			RGBDS_OBJECT_REV, revNum);

	uint32_t nbSymbols;
	uint32_t nbSections;

	tryReadlong(nbSymbols, file, "%s: Cannot read number of symbols: %s",
		    fileName);
	tryReadlong(nbSections, file, "%s: Cannot read number of sections: %s",
		    fileName);

	nbSectionsToAssign += nbSections;

	tryReadlong(nodes[fileID].nbNodes, file, "%s: Cannot read number of nodes: %s", fileName);
	nodes[fileID].nodes =
		(struct FileStackNode *)calloc(nodes[fileID].nbNodes, sizeof(nodes[fileID].nodes[0]));
	if (!nodes[fileID].nodes)
		err("Failed to get memory for %s's nodes", fileName);
	verbosePrint("Reading %u nodes...\n", nodes[fileID].nbNodes);
	for (uint32_t i = nodes[fileID].nbNodes; i--; )
		readFileStackNode(file, nodes[fileID].nodes, i, fileName);

	// This file's symbols, kept to link sections to them
	struct Symbol **fileSymbols = (struct Symbol **)malloc(sizeof(*fileSymbols) * nbSymbols + 1);

	if (!fileSymbols)
		err("Failed to get memory for %s's symbols", fileName);

	struct SymbolList *symbolList = (struct SymbolList *)malloc(sizeof(*symbolList));

	if (!symbolList)
		err("Failed to register %s's symbol list", fileName);
	symbolList->symbolList = fileSymbols;
	symbolList->nbSymbols = nbSymbols;
	symbolList->next = symbolLists;
	symbolLists = symbolList;

	uint32_t *nbSymPerSect = (uint32_t *)calloc(nbSections ? nbSections : 1,
					sizeof(*nbSymPerSect));

	verbosePrint("Reading %" PRIu32 " symbols...\n", nbSymbols);
	for (uint32_t i = 0; i < nbSymbols; i++) {
		// Read symbol
		struct Symbol *symbol = (struct Symbol *)malloc(sizeof(*symbol));

		if (!symbol)
			err("%s: Couldn't create new symbol", fileName);
		readSymbol(file, symbol, fileName, nodes[fileID].nodes);

		fileSymbols[i] = symbol;
		if (symbol->type == SYMTYPE_EXPORT)
			sym_AddSymbol(symbol);
		if (symbol->sectionID != -1)
			nbSymPerSect[symbol->sectionID]++;
	}

	// This file's sections, stored in a table to link symbols to them
	struct Section **fileSections =
		(struct Section **)malloc(sizeof(*fileSections) * (nbSections ? nbSections : 1));

	verbosePrint("Reading %" PRIu32 " sections...\n", nbSections);
	for (uint32_t i = 0; i < nbSections; i++) {
		// Read section
		fileSections[i] = (struct Section *)malloc(sizeof(*fileSections[i]));
		if (!fileSections[i])
			err("%s: Couldn't create new section", fileName);

		fileSections[i]->nextu = NULL;
		readSection(file, fileSections[i], fileName, nodes[fileID].nodes);
		fileSections[i]->fileSymbols = fileSymbols;
		if (nbSymPerSect[i]) {
			fileSections[i]->symbols =
				(struct Symbol **)malloc(nbSymPerSect[i] * sizeof(*fileSections[i]->symbols));
			if (!fileSections[i]->symbols)
				err("%s: Couldn't link to symbols",
				    fileName);
		} else {
			fileSections[i]->symbols = NULL;
		}
		fileSections[i]->nbSymbols = 0;

		sect_AddSection(fileSections[i]);
	}

	free(nbSymPerSect);

	// Give patches' PC section pointers to their sections
	for (uint32_t i = 0; i < nbSections; i++) {
		if (sect_HasData(fileSections[i]->type)) {
			for (uint32_t j = 0; j < fileSections[i]->nbPatches; j++)
				linkPatchToPCSect(&fileSections[i]->patches[j], fileSections);
		}
	}

	// Give symbols' section pointers to their sections
	for (uint32_t i = 0; i < nbSymbols; i++) {
		int32_t sectionID = fileSymbols[i]->sectionID;

		if (sectionID == -1) {
			fileSymbols[i]->section = NULL;
		} else {
			struct Section *section = fileSections[sectionID];

			// Give the section a pointer to the symbol as well
			linkSymToSect(fileSymbols[i], section);

			if (section->modifier != SECTION_NORMAL) {
				if (section->modifier == SECTION_FRAGMENT)
					// Add the fragment's offset to the symbol's
					fileSymbols[i]->offset += section->offset;
				section = getMainSection(section);
			}
			fileSymbols[i]->section = section;
		}
	}

	uint32_t nbAsserts;

	tryReadlong(nbAsserts, file, "%s: Cannot read number of assertions: %s",
		    fileName);
	verbosePrint("Reading %" PRIu32 " assertions...\n", nbAsserts);
	for (uint32_t i = 0; i < nbAsserts; i++) {
		struct Assertion *assertion = (struct Assertion *)malloc(sizeof(*assertion));

		if (!assertion)
			err("%s: Couldn't create new assertion", fileName);
		readAssertion(file, assertion, fileName, i, nodes[fileID].nodes);
		linkPatchToPCSect(&assertion->patch, fileSections);
		assertion->fileSymbols = fileSymbols;
		assertion->next = assertions;
		assertions = assertion;
	}

	free(fileSections);
	fclose(file);
}